

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_acc::build_graph(test_acc *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  
  pgVar1 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne_a)._M_elems)
  ;
  ggml_set_param(ctx,pgVar1);
  ggml_set_name(pgVar1,"a");
  pgVar2 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne_b)._M_elems)
  ;
  ggml_set_param(ctx,pgVar2);
  ggml_set_name(pgVar2,"b");
  pgVar1 = (ggml_tensor *)
           ggml_acc(ctx,pgVar1,pgVar2,pgVar1->nb[1],pgVar1->nb[2],pgVar1->nb[3],pgVar2->nb[1]);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne_a.data());
        ggml_set_param(ctx, a);
        ggml_set_name(a, "a");

        ggml_tensor * b = ggml_new_tensor(ctx, type, 4, ne_b.data());
        ggml_set_param(ctx, b);
        ggml_set_name(b, "b");

        ggml_tensor * out = ggml_acc(ctx, a, b, a->nb[1], a->nb[2], a->nb[3], b->nb[1]);
        ggml_set_name(out, "out");

        return out;
    }